

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O0

void __thiscall tt::net::EventLoop::~EventLoop(EventLoop *this)

{
  long *in_FS_OFFSET;
  EventLoop *this_local;
  
  close(this->m_wakeupFd);
  *(undefined8 *)(*in_FS_OFFSET + -0x40) = 0;
  std::shared_ptr<tt::net::Channel>::~shared_ptr(&this->m_wakeupChannel);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_pendingFunctors);
  MutexLock::~MutexLock(&this->m_mutex);
  std::shared_ptr<tt::net::Epoll>::~shared_ptr(&this->m_epoll);
  return;
}

Assistant:

EventLoop::~EventLoop(){
	
	close(m_wakeupFd);
	t_loopInTishThread = NULL;
}